

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

bool setUpContainer(Container *container)

{
  pointer pcVar1;
  Verbosity VVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  thread local_208;
  thread networkWorker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string currentUser;
  string containerDir;
  Container *local_38;
  Container *container_local;
  
  local_38 = container;
  VVar2 = loguru::current_verbosity_cutoff();
  if (-1 < VVar2) {
    loguru::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  setUpContainerImage(local_38);
  if (local_38->buildImage == false) {
    setUpContainerOverlayFs(local_38);
  }
  pcVar1 = (local_38->currentUser)._M_dataplus._M_p;
  local_80 = (undefined1  [8])&currentUser._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + (local_38->currentUser)._M_string_length);
  pcVar1 = (local_38->dir)._M_dataplus._M_p;
  currentUser.field_2._8_8_ = &containerDir._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&currentUser.field_2 + 8),pcVar1,
             pcVar1 + (local_38->dir)._M_string_length);
  sprintf((char *)&local_208,"chown -R %s %s",local_80,currentUser.field_2._8_8_);
  iVar3 = system((char *)&local_208);
  if (iVar3 != -1) {
    VVar2 = loguru::current_verbosity_cutoff();
    if (-1 < VVar2) {
      loguru::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    }
    VVar2 = loguru::current_verbosity_cutoff();
    if (-1 < VVar2) {
      loguru::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    }
    if ((size_type *)currentUser.field_2._8_8_ != &containerDir._M_string_length) {
      operator_delete((void *)currentUser.field_2._8_8_,containerDir._M_string_length + 1);
    }
    if (local_80 != (undefined1  [8])&currentUser._M_string_length) {
      operator_delete((void *)local_80,currentUser._M_string_length + 1);
    }
    std::thread::thread<void(&)(Container*),Container*&,void>
              (&local_208,initializeContainerNetwork,&local_38);
    std::thread::detach();
    if (local_208._M_id._M_thread == 0) {
      return true;
    }
    std::terminate();
  }
  containerDir.field_2._8_8_ = __cxa_allocate_exception(0x10);
  std::operator+(&local_e0,"Make",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_a0._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_a0._M_dataplus._M_p == psVar5) {
    local_a0.field_2._M_allocated_capacity = *psVar5;
    local_a0.field_2._8_8_ = plVar4[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar5;
  }
  local_a0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::operator+(&local_100,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&currentUser.field_2 + 8));
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_c0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_c0 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar6;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error((runtime_error *)containerDir.field_2._8_8_,(string *)&local_c0)
  ;
  __cxa_throw(containerDir.field_2._8_8_,&std::runtime_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

bool setUpContainer(Container* container)
{
    LOG_F(INFO, "Set up container %s", container->id.c_str());
    try
    {
        setUpContainerImage(container);
        if (!container->buildImage)
            setUpContainerOverlayFs(container);

        // Makes the current user the owner of the container directory
        char buffer[256];
        std::string currentUser = container->currentUser;
        std::string containerDir = container->dir;
        sprintf(buffer, "chown -R %s %s", currentUser.c_str(), containerDir.c_str());
        if (system(buffer) == -1)
            throw std::runtime_error("Make" + currentUser + " the owner of " + containerDir + ": FAILED");
        else
            LOG_F(INFO, "Setting the owner of %s to %s", containerDir.c_str(), currentUser.c_str());
        LOG_F(INFO, "Set up container %s: SUCCESS", container->id.c_str());
    }
    catch (std::exception& ex)
    {
        LOG_F(ERROR, "Set up container %s: FAILED", container->id.c_str());
        LOG_F(ERROR, "%s", ex.what());
        return false;
    }
    // Spawns a worker thread to initialize the network environment for the container
    std::thread networkWorker(initializeContainerNetwork, container);
    networkWorker.detach();
    return true;
}